

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::EdgeChainSimplifier::OutputAllEdges(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  bool bVar1;
  EdgeId *pEVar2;
  Iterator local_50;
  EdgeId e_1;
  Iterator __end1_1;
  Iterator __begin1_1;
  VertexOutEdgeIds *__range1_1;
  Iterator local_30;
  EdgeId e;
  Iterator __end1;
  Iterator __begin1;
  VertexOutEdgeIds *__range1;
  VertexId v1_local;
  VertexId v0_local;
  EdgeChainSimplifier *this_local;
  
  ___end1 = Graph::VertexOutMap::edge_ids(&this->out_,v0,v1);
  e = (EdgeId)Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end1);
  local_30 = Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end1);
  while( true ) {
    bVar1 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e,&local_30);
    if (!bVar1) break;
    pEVar2 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e);
    OutputEdge(this,*pEVar2);
    Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e);
  }
  ___end1_1 = Graph::VertexOutMap::edge_ids(&this->out_,v1,v0);
  e_1 = (EdgeId)Graph::VertexOutEdgeIds::begin((VertexOutEdgeIds *)&__end1_1);
  local_50 = Graph::VertexOutEdgeIds::end((VertexOutEdgeIds *)&__end1_1);
  while( true ) {
    bVar1 = Graph::VertexOutEdgeIds::Iterator::operator!=((Iterator *)&e_1,&local_50);
    if (!bVar1) break;
    pEVar2 = Graph::VertexOutEdgeIds::Iterator::operator*((Iterator *)&e_1);
    OutputEdge(this,*pEVar2);
    Graph::VertexOutEdgeIds::Iterator::operator++((Iterator *)&e_1);
  }
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::OutputAllEdges(VertexId v0, VertexId v1) {
  for (EdgeId e : out_.edge_ids(v0, v1)) OutputEdge(e);
  for (EdgeId e : out_.edge_ids(v1, v0)) OutputEdge(e);
}